

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoConvert<float,unsigned_long>(Thread *this,Ptr *out_trap)

{
  Store *store;
  bool bVar1;
  f32 value;
  allocator<char> local_61;
  string local_60;
  Ptr local_40;
  u64 local_28;
  unsigned_long val;
  Ptr *out_trap_local;
  Thread *this_local;
  
  val = (unsigned_long)out_trap;
  out_trap_local = (Ptr *)this;
  local_28 = Pop<unsigned_long>(this);
  bVar1 = CanConvert<float,unsigned_long>(local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    value = Convert<float,unsigned_long>(local_28);
    Push<float>(this,(float)value);
    this_local._4_4_ = Ok;
  }
  else {
    store = this->store_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"integer overflow",&local_61);
    Trap::New(&local_40,store,&local_60,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=((RefPtr<wabt::interp::Trap> *)val,&local_40);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}